

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementQuantity::IfcElementQuantity(IfcElementQuantity *this)

{
  IfcElementQuantity *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xf8,"IfcElementQuantity");
  IfcPropertySetDefinition::IfcPropertySetDefinition
            (&this->super_IfcPropertySetDefinition,&PTR_construction_vtable_24__010f51a8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementQuantity,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementQuantity,_2UL> *)
             &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8,
             &PTR_construction_vtable_24__010f5220);
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x10f50f0;
  *(undefined8 *)&this->field_0xf8 = 0x10f5190;
  *(undefined8 *)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x88 =
       0x10f5118;
  *(undefined8 *)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x98 =
       0x10f5140;
  *(undefined8 *)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8 =
       0x10f5168;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_IfcPropertySetDefinition).field_0xb8);
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL>::ListOf
            (&this->Quantities);
  return;
}

Assistant:

IfcElementQuantity() : Object("IfcElementQuantity") {}